

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O2

void __thiscall
VertexAttrib64Bit::LimitTest::prepareVertexArray
          (LimitTest *this,_iteration iteration,_attributeType attribute_type,GLuint program_id,
          bool use_arrays)

{
  GLuint GVar1;
  GLenum GVar2;
  GLuint GVar3;
  int n_type;
  int iVar4;
  attributeConfiguration configuration;
  attributeConfiguration local_60;
  
  GVar1 = Base::GetMaxVertexAttribs(&this->super_Base);
  local_60.m_n_attributes_per_group = 0;
  local_60.m_type_names = (GLchar **)0x0;
  local_60.m_vertex_length = 0;
  local_60.m_n_elements = (GLint *)0x0;
  local_60.m_n_rows = (GLint *)0x0;
  local_60.m_n_types = 0;
  getVertexArrayConfiguration(this,iteration,&local_60);
  GVar3 = 0;
  if ((int)GVar1 < 1) {
    GVar1 = GVar3;
  }
  for (; GVar1 != GVar3; GVar3 = GVar3 + 1) {
    (*(this->super_Base).gl.vertexAttribDivisor)(GVar3,(uint)(attribute_type == PER_INSTANCE));
    GVar2 = (*(this->super_Base).gl.getError)();
    glu::checkError(GVar2,"VertexAttribDivisor",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                    ,0x917);
    (*(this->super_Base).gl.disableVertexAttribArray)(GVar3);
    GVar2 = (*(this->super_Base).gl.getError)();
    glu::checkError(GVar2,"DisableVertexAttribArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                    ,0x91a);
  }
  n_type = 0;
  iVar4 = local_60.m_n_types;
  if (local_60.m_n_types < 1) {
    iVar4 = 0;
  }
  for (; iVar4 != n_type; n_type = n_type + 1) {
    configureAttribute(this,iteration,&local_60,n_type,program_id,use_arrays,
                       attribute_type != CONSTANT);
  }
  return;
}

Assistant:

void LimitTest::prepareVertexArray(_iteration iteration, _attributeType attribute_type, GLuint program_id,
								   bool use_arrays) const
{
	const GLint  max_vertex_attribs	= GetMaxVertexAttribs();
	const GLuint vertex_attrib_divisor = (PER_INSTANCE == attribute_type) ? 1 : 0;

	attributeConfiguration configuration;

	getVertexArrayConfiguration(iteration, configuration);

	/* Set vertex attributes divisor and disable */
	for (GLint i = 0; i < max_vertex_attribs; ++i)
	{
		gl.vertexAttribDivisor(i, vertex_attrib_divisor);
		GLU_EXPECT_NO_ERROR(gl.getError(), "VertexAttribDivisor");

		gl.disableVertexAttribArray(i);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DisableVertexAttribArray");
	}

	for (GLint n_type = 0; n_type < configuration.m_n_types; ++n_type)
	{
		configureAttribute(iteration, configuration, n_type, program_id, use_arrays, (CONSTANT != attribute_type));
	}
}